

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_class.c
# Opt level: O0

void oonf_class_remove(oonf_class *ci)

{
  list_entity *plVar1;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  oonf_class_extension *iterator;
  oonf_class_extension *ext;
  oonf_class *ci_local;
  
  avl_remove(&_classes_tree,&ci->_node);
  _free_freelist(ci);
  plVar1 = (ci->_extensions).next;
  iterator = (oonf_class_extension *)&plVar1[-4].prev;
  plVar1 = plVar1->next;
  while( true ) {
    __tempptr = (list_entity *)&plVar1[-4].prev;
    if ((iterator->_node).prev == (ci->_extensions).prev) break;
    oonf_class_extension_remove(iterator);
    iterator = (oonf_class_extension *)__tempptr;
    plVar1 = plVar1->next;
  }
  if (((&log_global_mask)[_oonf_class_subsystem.logging] & 1) != 0) {
    oonf_log(1,_oonf_class_subsystem.logging,"src/base/oonf_class.c",0x99,0,0,"Class %s removed\n",
             ci->name);
  }
  return;
}

Assistant:

void
oonf_class_remove(struct oonf_class *ci) {
  struct oonf_class_extension *ext, *iterator;

  /* remove memcookie from tree */
  avl_remove(&_classes_tree, &ci->_node);

  /* remove all free memory blocks */
  _free_freelist(ci);

  /* remove all listeners */
  list_for_each_element_safe(&ci->_extensions, ext, _node, iterator) {
    oonf_class_extension_remove(ext);
  }

  OONF_DEBUG(LOG_CLASS, "Class %s removed\n", ci->name);
}